

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ReusableStringStream::ReusableStringStream(ReusableStringStream *this)

{
  StringStreams *pSVar1;
  size_t sVar2;
  reference this_00;
  pointer pbVar3;
  ReusableStringStream *this_local;
  
  NonCopyable::NonCopyable(&this->super_NonCopyable);
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_0023e3e8;
  pSVar1 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getMutable()
  ;
  sVar2 = StringStreams::add(pSVar1);
  this->m_index = sVar2;
  pSVar1 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getMutable()
  ;
  this_00 = clara::std::
            vector<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator[](&pSVar1->m_streams,this->m_index);
  pbVar3 = clara::std::
           unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get(this_00);
  this->m_oss = (ostream *)pbVar3;
  return;
}

Assistant:

ReusableStringStream::ReusableStringStream()
    :   m_index( Singleton<StringStreams>::getMutable().add() ),
        m_oss( Singleton<StringStreams>::getMutable().m_streams[m_index].get() )
    {}